

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O2

int mg_start_thread_with_id(mg_thread_func_t func,void *param,pthread_t *threadidptr)

{
  int iVar1;
  pthread_t thread_id;
  pthread_attr_t attr;
  pthread_t local_68;
  pthread_attr_t local_60;
  
  pthread_attr_init(&local_60);
  iVar1 = pthread_create(&local_68,&local_60,(__start_routine *)func,param);
  pthread_attr_destroy(&local_60);
  if (threadidptr != (pthread_t *)0x0 && iVar1 == 0) {
    *threadidptr = local_68;
  }
  return iVar1;
}

Assistant:

static int
mg_start_thread_with_id(mg_thread_func_t func,
                        void *param,
                        pthread_t *threadidptr)
{
	pthread_t thread_id;
	pthread_attr_t attr;
	int result;

	(void)pthread_attr_init(&attr);

#if defined(__ZEPHYR__)
	pthread_attr_setstack(&attr,
	                      &civetweb_worker_stacks[zephyr_worker_stack_index++],
	                      ZEPHYR_STACK_SIZE);
#elif defined(USE_STACK_SIZE) && (USE_STACK_SIZE > 1)
	/* Compile-time option to control stack size,
	 * e.g. -DUSE_STACK_SIZE=16384 */
	(void)pthread_attr_setstacksize(&attr, USE_STACK_SIZE);
#endif /* defined(USE_STACK_SIZE) && USE_STACK_SIZE > 1 */

	result = pthread_create(&thread_id, &attr, func, param);
	pthread_attr_destroy(&attr);
	if ((result == 0) && (threadidptr != NULL)) {
		*threadidptr = thread_id;
	}
	return result;
}